

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O2

boolean decode_mcu_sub(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  int *piVar3;
  JBLOCKROW paJVar4;
  d_derived_tbl *pdVar5;
  jpeg_source_mgr *pjVar6;
  boolean bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int bits_left;
  _func_void_j_decompress_ptr *get_buffer;
  int iVar14;
  int min_bits;
  uint uVar15;
  bitread_working_state br_state;
  savable_state state;
  
  pjVar2 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar2[3].decode_mcu != 0)) ||
     (bVar7 = process_restart(cinfo), bVar7 != 0)) {
    if (*(int *)((long)&pjVar2[3].start_pass + 4) == 0) {
      piVar3 = cinfo->natural_order;
      iVar1 = cinfo->lim_Se;
      br_state.next_input_byte = cinfo->src->next_input_byte;
      br_state.bytes_in_buffer = cinfo->src->bytes_in_buffer;
      get_buffer = pjVar2[1].start_pass;
      bits_left = *(int *)&pjVar2[1].decode_mcu;
      state.last_dc_val[3] = *(int *)&pjVar2[3].start_pass;
      state._0_8_ = pjVar2[2].start_pass;
      state.last_dc_val._4_8_ = pjVar2[2].decode_mcu;
      br_state.cinfo = cinfo;
      for (lVar13 = 0; lVar13 < cinfo->blocks_in_MCU; lVar13 = lVar13 + 1) {
        paJVar4 = MCU_data[lVar13];
        pdVar5 = (d_derived_tbl *)(&pjVar2[10].decode_mcu)[lVar13];
        if (bits_left < 8) {
          bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,0);
          if (bVar7 == 0) {
            return 0;
          }
          iVar14 = 1;
          get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
          bits_left = br_state.bits_left;
          if (7 < br_state.bits_left) goto LAB_00110863;
LAB_0011088e:
          uVar10 = jpeg_huff_decode(&br_state,(bit_buf_type)get_buffer,bits_left,pdVar5,iVar14);
          get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
          bits_left = br_state.bits_left;
          if ((int)uVar10 < 0) goto LAB_00110b5d;
        }
        else {
LAB_00110863:
          uVar12 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
          if (pdVar5->look_nbits[uVar12] == 0) {
            iVar14 = 9;
            goto LAB_0011088e;
          }
          uVar10 = (uint)pdVar5->look_sym[uVar12];
          bits_left = bits_left - pdVar5->look_nbits[uVar12];
        }
        pdVar5 = (d_derived_tbl *)(&pjVar2[0xf].decode_mcu)[lVar13];
        iVar14 = *(int *)((long)&pjVar2[0x14].decode_mcu + lVar13 * 4);
        if (iVar14 == 0) {
          if (uVar10 != 0) {
            if ((bits_left < (int)uVar10) &&
               (bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,uVar10),
               get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
               bits_left = br_state.bits_left, bVar7 == 0)) goto LAB_00110b5d;
            bits_left = bits_left - uVar10;
          }
          iVar9 = 1;
        }
        else {
          if (uVar10 == 0) {
            iVar9 = 0;
          }
          else {
            if ((bits_left < (int)uVar10) &&
               (bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,uVar10),
               get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
               bits_left = br_state.bits_left, bVar7 == 0)) goto LAB_00110b5d;
            bits_left = bits_left - uVar10;
            uVar15 = bmask[uVar10];
            uVar8 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & uVar15;
            if (bmask[uVar10 - 1] < (int)uVar8) {
              uVar15 = 0;
            }
            iVar9 = uVar8 - uVar15;
          }
          iVar9 = iVar9 + state.last_dc_val[cinfo->MCU_membership[lVar13]];
          state.last_dc_val[cinfo->MCU_membership[lVar13]] = iVar9;
          (*paJVar4)[0] = (JCOEF)iVar9;
          for (iVar9 = 1; iVar9 < iVar14; iVar9 = iVar9 + 1) {
            if (bits_left < 8) {
              bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,0);
              if (bVar7 == 0) {
                return 0;
              }
              min_bits = 1;
              get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
              bits_left = br_state.bits_left;
              if (7 < br_state.bits_left) goto LAB_00110a76;
LAB_00110aa1:
              uVar10 = jpeg_huff_decode(&br_state,(bit_buf_type)get_buffer,bits_left,pdVar5,min_bits
                                       );
              get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
              bits_left = br_state.bits_left;
              if ((int)uVar10 < 0) goto LAB_00110b5d;
            }
            else {
LAB_00110a76:
              uVar12 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
              if (pdVar5->look_nbits[uVar12] == 0) {
                min_bits = 9;
                goto LAB_00110aa1;
              }
              uVar10 = (uint)pdVar5->look_sym[uVar12];
              bits_left = bits_left - pdVar5->look_nbits[uVar12];
            }
            uVar15 = uVar10 & 0xf;
            if (uVar15 == 0) {
              if (uVar10 >> 4 != 0xf) goto LAB_00110b46;
              iVar9 = iVar9 + 0xf;
            }
            else {
              if ((bits_left < (int)uVar15) &&
                 (bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,uVar15),
                 get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
                 bits_left = br_state.bits_left, bVar7 == 0)) goto LAB_00110b5d;
              bits_left = bits_left - uVar15;
              uVar11 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & bmask[uVar15];
              uVar8 = 0;
              if ((int)uVar11 <= bmask[uVar15 - 1]) {
                uVar8 = bmask[uVar15];
              }
              iVar9 = (uVar10 >> 4) + iVar9;
              (*paJVar4)[piVar3[iVar9]] = (short)uVar11 - (short)uVar8;
            }
          }
        }
        for (; iVar9 <= iVar1; iVar9 = iVar9 + (uVar10 >> 4) + 1) {
          if (bits_left < 8) {
            bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,0);
            if (bVar7 == 0) {
              return 0;
            }
            iVar14 = 1;
            get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
            bits_left = br_state.bits_left;
            if (7 < br_state.bits_left) goto LAB_0011098c;
LAB_001109b7:
            uVar10 = jpeg_huff_decode(&br_state,(bit_buf_type)get_buffer,bits_left,pdVar5,iVar14);
            get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer;
            bits_left = br_state.bits_left;
            if ((int)uVar10 < 0) goto LAB_00110b5d;
          }
          else {
LAB_0011098c:
            uVar12 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
            if (pdVar5->look_nbits[uVar12] == 0) {
              iVar14 = 9;
              goto LAB_001109b7;
            }
            uVar10 = (uint)pdVar5->look_sym[uVar12];
            bits_left = bits_left - pdVar5->look_nbits[uVar12];
          }
          uVar15 = uVar10 & 0xf;
          if (uVar15 == 0) {
            if (uVar10 >> 4 != 0xf) break;
          }
          else {
            if ((bits_left < (int)uVar15) &&
               (bVar7 = jpeg_fill_bit_buffer(&br_state,(bit_buf_type)get_buffer,bits_left,uVar15),
               get_buffer = (_func_void_j_decompress_ptr *)br_state.get_buffer,
               bits_left = br_state.bits_left, bVar7 == 0)) goto LAB_00110b5d;
            bits_left = bits_left - uVar15;
          }
        }
LAB_00110b46:
      }
      pjVar6 = cinfo->src;
      pjVar6->next_input_byte = br_state.next_input_byte;
      pjVar6->bytes_in_buffer = br_state.bytes_in_buffer;
      pjVar2[1].start_pass = get_buffer;
      *(int *)&pjVar2[1].decode_mcu = bits_left;
      *(int *)&pjVar2[3].start_pass = state.last_dc_val[3];
      pjVar2[2].start_pass = (_func_void_j_decompress_ptr *)state._0_8_;
      pjVar2[2].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)state.last_dc_val._4_8_
      ;
    }
    bVar7 = 1;
    *(int *)&pjVar2[3].decode_mcu = *(int *)&pjVar2[3].decode_mcu + -1;
  }
  else {
LAB_00110b5d:
    bVar7 = 0;
  }
  return bVar7;
}

Assistant:

METHODDEF(boolean)
decode_mcu_sub (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  const int * natural_order;
  int Se, blkn;
  BITREAD_STATE_VARS;
  savable_state state;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (! entropy->insufficient_data) {

    natural_order = cinfo->natural_order;
    Se = cinfo->lim_Se;

    /* Load up working state */
    BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
    ASSIGN_STATE(state, entropy->saved);

    /* Outer loop handles each block in the MCU */

    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      JBLOCKROW block = MCU_data[blkn];
      d_derived_tbl * htbl;
      register int s, k, r;
      int coef_limit, ci;

      /* Decode a single block's worth of coefficients */

      /* Section F.2.2.1: decode the DC coefficient difference */
      htbl = entropy->dc_cur_tbls[blkn];
      HUFF_DECODE(s, br_state, htbl, return FALSE, label1);

      htbl = entropy->ac_cur_tbls[blkn];
      k = 1;
      coef_limit = entropy->coef_limit[blkn];
      if (coef_limit) {
	/* Convert DC difference to actual value, update last_dc_val */
	if (s) {
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  r = GET_BITS(s);
	  s = HUFF_EXTEND(r, s);
	}
	ci = cinfo->MCU_membership[blkn];
	s += state.last_dc_val[ci];
	state.last_dc_val[ci] = s;
	/* Output the DC coefficient */
	(*block)[0] = (JCOEF) s;

	/* Section F.2.2.2: decode the AC coefficients */
	/* Since zeroes are skipped, output area must be cleared beforehand */
	for (; k < coef_limit; k++) {
	  HUFF_DECODE(s, br_state, htbl, return FALSE, label2);

	  r = s >> 4;
	  s &= 15;

	  if (s) {
	    k += r;
	    CHECK_BIT_BUFFER(br_state, s, return FALSE);
	    r = GET_BITS(s);
	    s = HUFF_EXTEND(r, s);
	    /* Output coefficient in natural (dezigzagged) order.
	     * Note: the extra entries in natural_order[] will save us
	     * if k > Se, which could happen if the data is corrupted.
	     */
	    (*block)[natural_order[k]] = (JCOEF) s;
	  } else {
	    if (r != 15)
	      goto EndOfBlock;
	    k += 15;
	  }
	}
      } else {
	if (s) {
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  DROP_BITS(s);
	}
      }

      /* Section F.2.2.2: decode the AC coefficients */
      /* In this path we just discard the values */
      for (; k <= Se; k++) {
	HUFF_DECODE(s, br_state, htbl, return FALSE, label3);

	r = s >> 4;
	s &= 15;

	if (s) {
	  k += r;
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  DROP_BITS(s);
	} else {
	  if (r != 15)
	    break;
	  k += 15;
	}
      }

      EndOfBlock: ;
    }

    /* Completed MCU, so update state */
    BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    ASSIGN_STATE(entropy->saved, state);
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;
}